

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O2

AnyCellmlElementPtr __thiscall libcellml::Annotator::item(Annotator *this,string *id,size_t index)

{
  element_type *peVar1;
  LoggerImpl *pLVar2;
  bool bVar3;
  AnnotatorImpl *pAVar4;
  size_t in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  AnyCellmlElementPtr AVar6;
  vector<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
  local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  
  pAVar4 = (AnnotatorImpl *)Logger::pFunc((Logger *)id);
  AnnotatorImpl::update(pAVar4);
  pAVar4 = (AnnotatorImpl *)Logger::pFunc((Logger *)id);
  bVar3 = AnnotatorImpl::exists(pAVar4,(string *)index,in_RCX,false);
  if (bVar3) {
    items(&local_40,(Annotator *)id,(string *)index);
    peVar1 = local_40.
             super__Vector_base<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
             ._M_impl.super__Vector_impl_data._M_start[in_RCX].
             super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pLVar2 = (LoggerImpl *)
             local_40.
             super__Vector_base<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
             ._M_impl.super__Vector_impl_data._M_start[in_RCX].
             super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
    local_40.
    super__Vector_base<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
    ._M_impl.super__Vector_impl_data._M_start[in_RCX].
    super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_Logger)._vptr_Logger = (_func_int **)peVar1;
    (this->super_Logger).mPimpl = pLVar2;
    local_40.
    super__Vector_base<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
    ._M_impl.super__Vector_impl_data._M_start[in_RCX].
    super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::
    vector<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
    ::~vector(&local_40);
    _Var5._M_pi = extraout_RDX;
  }
  else {
    AVar6 = AnyCellmlElement::AnyCellmlElementImpl::create();
    _Var5 = AVar6.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  AVar6.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var5._M_pi;
  AVar6.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (AnyCellmlElementPtr)
         AVar6.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

AnyCellmlElementPtr Annotator::item(const std::string &id, size_t index)
{
    pFunc()->update();
    return pFunc()->exists(id, index) ? std::move(items(id)[index]) : AnyCellmlElement::AnyCellmlElementImpl::create();
}